

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.h
# Opt level: O2

StringVector * __thiscall
CoreML::Specification::NonMaximumSuppression::mutable_stringclasslabels(NonMaximumSuppression *this)

{
  StringVector *this_00;
  
  if (this->_oneof_case_[1] == 100) {
    this_00 = (this->ClassLabels_).stringclasslabels_;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[1] = 100;
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->ClassLabels_).stringclasslabels_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::StringVector* NonMaximumSuppression::mutable_stringclasslabels() {
  if (!has_stringclasslabels()) {
    clear_ClassLabels();
    set_has_stringclasslabels();
    ClassLabels_.stringclasslabels_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NonMaximumSuppression.stringClassLabels)
  return ClassLabels_.stringclasslabels_;
}